

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmState *this_01;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  ulong uVar7;
  char *destination;
  ostream *poVar8;
  FILE *__stream;
  size_t sVar9;
  bool collapse;
  size_t *local_11d8;
  char *c;
  size_t n;
  char buffer [4096];
  int bufferSize;
  FILE *fin;
  int res;
  string resultArg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string outFile;
  string inFile;
  string local_128;
  string local_108 [8];
  string modulesPath;
  cmGlobalGenerator *gen;
  string value;
  string arg;
  uint i;
  undefined1 local_90 [3];
  bool writeToStdout;
  string destPath;
  undefined1 local_60 [8];
  string cwd;
  string resultFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  std::__cxx11::string::string((string *)(cwd.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_60,(SystemTools *)0x1,collapse);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 "/__cmake_systeminformation");
  cmsys::SystemTools::RemoveADirectory((string *)local_90);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::MakeDirectory(pcVar3);
  if (bVar1) {
    bVar1 = true;
    for (arg.field_2._12_4_ = 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args), (uint)arg.field_2._12_4_ < sVar4;
        arg.field_2._12_4_ = arg.field_2._12_4_ + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)(uint)arg.field_2._12_4_);
      std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8),(string *)pvVar5);
      lVar6 = std::__cxx11::string::find(value.field_2._M_local_buf + 8,0xa7004d);
      if (lVar6 == 0) {
        this->Verbose = true;
LAB_006b82d2:
        bVar2 = false;
      }
      else {
        lVar6 = std::__cxx11::string::find(value.field_2._M_local_buf + 8,0xa88bff);
        if (lVar6 != 0) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar3);
          if (!bVar1) {
            std::__cxx11::string::operator=
                      ((string *)(cwd.field_2._M_local_buf + 8),(string *)local_60);
            std::__cxx11::string::operator+=((string *)(cwd.field_2._M_local_buf + 8),"/");
          }
          std::__cxx11::string::operator+=
                    ((string *)(cwd.field_2._M_local_buf + 8),
                     (string *)(value.field_2._M_local_buf + 8));
          bVar1 = false;
          goto LAB_006b82d2;
        }
        std::__cxx11::string::substr((ulong)&gen,(ulong)((long)&value.field_2 + 8));
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
LAB_006b81c9:
          modulesPath.field_2._8_8_ = CreateGlobalGenerator(this,(string *)&gen);
          if ((cmGlobalGenerator *)modulesPath.field_2._8_8_ == (cmGlobalGenerator *)0x0) {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error("Could not create named generator ",pcVar3,(char *)0x0,(char *)0x0)
            ;
            PrintGeneratorList(this);
          }
          else {
            SetGlobalGenerator(this,(cmGlobalGenerator *)modulesPath.field_2._8_8_);
          }
          bVar2 = false;
        }
        else {
          arg.field_2._12_4_ = arg.field_2._12_4_ + 1;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg.field_2._12_4_ < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg.field_2._12_4_);
            std::__cxx11::string::operator=((string *)&gen,(string *)pvVar5);
            goto LAB_006b81c9;
          }
          cmSystemTools::Error("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
          PrintGeneratorList(this);
          this_local._4_4_ = -1;
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)&gen);
        if (!bVar2) goto LAB_006b82d2;
      }
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      if (bVar2) goto LAB_006b88e5;
    }
    AddCMakePaths(this);
    this_01 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_128,"CMAKE_ROOT",(allocator *)(inFile.field_2._M_local_buf + 0xf));
    pcVar3 = cmState::GetInitializedCacheValue(this_01,&local_128);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,pcVar3,(allocator *)(inFile.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(inFile.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)(inFile.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=(local_108,"/Modules");
    std::__cxx11::string::string((string *)(outFile.field_2._M_local_buf + 8),local_108);
    std::__cxx11::string::operator+=
              ((string *)(outFile.field_2._M_local_buf + 8),"/SystemInformation.cmake");
    std::__cxx11::string::string
              ((string *)
               &args2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_90);
    std::__cxx11::string::operator+=
              ((string *)
               &args2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"/CMakeLists.txt");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    destination = (char *)std::__cxx11::string::c_str();
    bVar2 = cmSystemTools::cmCopyFile(pcVar3,destination);
    if (bVar2) {
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=((string *)(cwd.field_2._M_local_buf + 8),(string *)local_60)
        ;
        std::__cxx11::string::operator+=
                  ((string *)(cwd.field_2._M_local_buf + 8),"/__cmake_systeminformation/results.txt"
                  );
      }
      cmsys::SystemTools::ChangeDirectory((string *)local_90);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&resultArg.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,pvVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&resultArg.field_2 + 8),(value_type *)local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&res,"-DRESULT_FILE=",(allocator *)((long)&fin + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&fin + 7));
      std::__cxx11::string::operator+=((string *)&res,(string *)(cwd.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&resultArg.field_2 + 8),(value_type *)&res);
      fin._0_4_ = Run(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&resultArg.field_2 + 8),false);
      if ((int)fin == 0) {
        cmsys::SystemTools::ChangeDirectory((string *)local_60);
        if ((bVar1) &&
           (__stream = (FILE *)cmsys::SystemTools::Fopen((string *)((long)&cwd.field_2 + 8),"r"),
           __stream != (FILE *)0x0)) {
          while (sVar9 = fread(&n,1,0x1000,__stream), sVar9 != 0) {
            for (local_11d8 = &n; local_11d8 < buffer + (sVar9 - 8);
                local_11d8 = (size_t *)((long)local_11d8 + 1)) {
              putc((int)(char)*local_11d8,_stdout);
            }
            fflush(_stdout);
          }
          fclose(__stream);
        }
        cmsys::SystemTools::RemoveADirectory((string *)local_90);
        this_local._4_4_ = 0;
      }
      else {
        std::operator<<((ostream *)&std::cerr,
                        "Error: --system-information failed on internal CMake!\n");
        this_local._4_4_ = (int)fin;
      }
      std::__cxx11::string::~string((string *)&res);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&resultArg.field_2 + 8));
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error copying file \"");
      poVar8 = std::operator<<(poVar8,(string *)(outFile.field_2._M_local_buf + 8));
      poVar8 = std::operator<<(poVar8,"\" to \"");
      poVar8 = std::operator<<(poVar8,(string *)
                                      &args2.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar8,"\".\n");
      this_local._4_4_ = 1;
    }
    std::__cxx11::string::~string
              ((string *)
               &args2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(outFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_108);
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Error: --system-information must be run from a writable directory!\n");
    this_local._4_4_ = 1;
  }
LAB_006b88e5:
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(cwd.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath.c_str()))
    {
    std::cerr << "Error: --system-information must be run from a "
      "writable directory!\n";
    return 1;
    }

  // process the arguments
  bool writeToStdout = true;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-V",0) == 0)
      {
      this->Verbose = true;
      }
    else if(arg.find("-G",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
          }
        value = args[i];
        }
      cmGlobalGenerator* gen =
        this->CreateGlobalGenerator(value);
      if(!gen)
        {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
        }
      else
        {
        this->SetGlobalGenerator(gen);
        }
      }
    // no option assume it is the output file
    else
      {
      if (!cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        resultFile = cwd;
        resultFile += "/";
        }
      resultFile += arg;
      writeToStdout = false;
      }
    }


  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath =
    this->State->GetInitializedCacheValue("CMAKE_ROOT");
  modulesPath += "/Modules";
  std::string inFile = modulesPath;
  inFile += "/SystemInformation.cmake";
  std::string outFile = destPath;
  outFile += "/CMakeLists.txt";

  // Copy file
  if(!cmSystemTools::cmCopyFile(inFile.c_str(), outFile.c_str()))
    {
    std::cerr << "Error copying file \"" << inFile
              << "\" to \"" << outFile << "\".\n";
    return 1;
    }

  // do we write to a file or to stdout?
  if (resultFile.empty())
    {
    resultFile = cwd;
    resultFile += "/__cmake_systeminformation/results.txt";
    }

  // now run cmake on the CMakeLists file
  cmSystemTools::ChangeDirectory(destPath);
  std::vector<std::string> args2;
  args2.push_back(args[0]);
  args2.push_back(destPath);
  std::string resultArg = "-DRESULT_FILE=";
  resultArg += resultFile;
  args2.push_back(resultArg);
  int res = this->Run(args2, false);

  if (res != 0)
    {
    std::cerr << "Error: --system-information failed on internal CMake!\n";
    return res;
    }

  // change back to the original directory
  cmSystemTools::ChangeDirectory(cwd);

  // echo results to stdout if needed
  if (writeToStdout)
    {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if(fin)
      {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while((n = fread(buffer, 1, bufferSize, fin)) > 0)
        {
        for(char* c = buffer; c < buffer+n; ++c)
          {
          putc(*c, stdout);
          }
        fflush(stdout);
        }
      fclose(fin);
      }
    }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}